

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
* __thiscall
libcellml::Annotator::items
          (vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
           *__return_storage_ptr__,Annotator *this,string *id)

{
  bool bVar1;
  AnnotatorImpl *pAVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
  pVar3;
  undefined1 local_60 [24];
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  it;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
  range;
  string *id_local;
  Annotator *this_local;
  vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  *items;
  
  pAVar2 = pFunc(this);
  AnnotatorImpl::update(pAVar2);
  range.second._M_node._7_1_ = 0;
  std::
  vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  ::vector(__return_storage_ptr__);
  pAVar2 = pFunc(this);
  pVar3 = std::
          multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
          ::equal_range(&pAVar2->mIdList,id);
  while( true ) {
    range.first = pVar3.second._M_node;
    local_60._16_8_ = pVar3.first._M_node;
    bVar1 = std::operator!=((_Self *)(local_60 + 0x10),&range.first);
    if (!bVar1) break;
    pAVar2 = pFunc(this);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>
                  *)(local_60 + 0x10));
    AnnotatorImpl::convertToShared((AnnotatorImpl *)local_60,(AnyCellmlElementPtr *)pAVar2);
    std::
    vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_60);
    std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr
              ((shared_ptr<libcellml::AnyCellmlElement> *)local_60);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>
                  *)(local_60 + 0x10));
    pVar3.second._M_node = range.first._M_node;
    pVar3.first._M_node = (_Base_ptr)local_60._16_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AnyCellmlElementPtr> Annotator::items(const std::string &id)
{
    pFunc()->update();
    std::vector<AnyCellmlElementPtr> items;
    auto range = pFunc()->mIdList.equal_range(id);
    for (auto it = range.first; it != range.second; ++it) {
        items.push_back(pFunc()->convertToShared(it->second));
    }
    return items;
}